

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O3

Ptr __thiscall core::image::byte_to_double_image(image *this,ConstPtr *image)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  element_type *peVar5;
  pointer puVar6;
  Image<double> *__p;
  invalid_argument *this_00;
  uint uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  ulong uVar9;
  _func_int **pp_Var10;
  Ptr PVar11;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    __p = (Image<double> *)operator_new(0x30);
    (__p->super_TypedImageBase<double>).super_ImageBase.w = 0;
    (__p->super_TypedImageBase<double>).super_ImageBase.h = 0;
    (__p->super_TypedImageBase<double>).super_ImageBase.c = 0;
    (__p->super_TypedImageBase<double>).data.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<double>).data.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<double>).data.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<double>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_0012f860;
    *(Image<double> **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<double>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    plVar4 = *(long **)this;
    peVar5 = (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar1 = (peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
    iVar2 = (peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
    iVar3 = (peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
    (**(code **)(*plVar4 + 0x40))(plVar4);
    *(int *)(plVar4 + 1) = iVar1;
    *(int *)((long)plVar4 + 0xc) = iVar2;
    *(int *)(plVar4 + 2) = iVar3;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)(plVar4 + 3),(long)(iVar2 * iVar1 * iVar3)
              );
    peVar5 = (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    puVar6 = (peVar5->super_TypedImageBase<unsigned_char>).data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (int)*(pointer *)
                  ((long)&(peVar5->super_TypedImageBase<unsigned_char>).data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 8) - (int)puVar6;
    _Var8._M_pi = extraout_RDX;
    if (0 < (int)uVar7) {
      _Var8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x18);
      uVar9 = 0;
      do {
        pp_Var10 = (_func_int **)((double)puVar6[uVar9] / 255.0);
        if ((double)pp_Var10 <= 0.0) {
          pp_Var10 = (_func_int **)0x0;
        }
        if (1.0 <= (double)pp_Var10) {
          pp_Var10 = (_func_int **)0x3ff0000000000000;
        }
        (&(_Var8._M_pi)->_vptr__Sp_counted_base)[uVar9] = pp_Var10;
        uVar9 = uVar9 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar9);
    }
    PVar11.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var8._M_pi;
    PVar11.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar11.super___shared_ptr<core::Image<double>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DoubleImage::Ptr
byte_to_double_image (ByteImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    DoubleImage::Ptr img = DoubleImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        double value = static_cast<double>(image->at(i)) / 255.0;
        img->at(i) = std::min(1.0, std::max(0.0, value));
    }
    return img;
}